

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

wstring * __thiscall
mjs::strip_format_control_characters_abi_cxx11_
          (wstring *__return_storage_ptr__,mjs *this,wstring_view *s)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  bVar3;
  wstring_view *s_local;
  wstring *res;
  
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)this);
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  pvVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)this);
  pvVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)this);
  bVar3 = std::back_inserter<std::__cxx11::wstring>(__return_storage_ptr__);
  std::
  copy_if<wchar_t_const*,std::back_insert_iterator<std::__cxx11::wstring>,mjs::strip_format_control_characters(std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&)::__0>
            (pvVar1,pvVar2,bVar3.container);
  return __return_storage_ptr__;
}

Assistant:

std::wstring strip_format_control_characters(const std::wstring_view& s) {
    std::wstring res;
    res.reserve(s.size());
    std::copy_if(s.begin(), s.end(), std::back_inserter(res), [](auto ch) { return !is_form_control(ch); });
    return res;
}